

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::ElemType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
          *values,ElemType *out,char *desc)

{
  ElemType *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  const_reference pvVar4;
  int __c;
  Var *var_00;
  Type local_94;
  undefined8 local_8c;
  Index local_84;
  Var local_80;
  char *local_38;
  char *desc_local;
  ElemType *out_local;
  vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
  *values_local;
  Var *var_local;
  SharedValidator *this_local;
  Result result;
  
  local_38 = desc;
  desc_local = (char *)out;
  out_local = (ElemType *)values;
  values_local = (vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                  *)var;
  var_local = (Var *)this;
  Var::Var(&local_80,var);
  sVar2 = std::
          vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
          ::size((vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                  *)out_local);
  var_00 = &local_80;
  this_local._4_4_ = CheckIndex(this,var_00,(Index)sVar2,local_38);
  Var::~Var(&local_80);
  if (desc_local != (char *)0x0) {
    bVar1 = Succeeded(this_local._4_4_);
    this_00 = out_local;
    if (bVar1) {
      pcVar3 = Var::index(var,(char *)var_00,__c);
      pvVar4 = std::
               vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
               ::operator[]((vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                             *)this_00,(ulong)pcVar3 & 0xffffffff);
      local_94 = pvVar4->element;
      local_8c._0_1_ = pvVar4->is_active;
      local_8c._1_3_ = *(undefined3 *)&pvVar4->field_0x9;
      local_8c._4_4_ = (pvVar4->table_type).enum_;
      local_84 = (pvVar4->table_type).type_index_;
    }
    else {
      memset(&local_94,0,0x14);
    }
    *(Type *)desc_local = local_94;
    *(undefined8 *)(desc_local + 8) = local_8c;
    *(Index *)(desc_local + 0x10) = local_84;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}